

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  vector<int,_std::allocator<int>_> *fields;
  pointer ppFVar1;
  FieldDescriptor *field_00;
  undefined8 *puVar2;
  Printer *pPVar3;
  pointer pvVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  CppType CVar10;
  uint uVar11;
  LogMessage *pLVar12;
  FieldGenerator *pFVar13;
  string *from;
  int cached_has_word_index_00;
  FieldDescriptor *has_bit_indices;
  FieldDescriptor *pFVar14;
  FieldDescriptor *field_01;
  AlphaNum *a;
  FieldDescriptor **field;
  pointer ppFVar15;
  ulong uVar16;
  int iVar17;
  Printer *in_R8;
  MessageGenerator *pMVar18;
  undefined8 *puVar19;
  anon_unknown_0 *this_00;
  FieldDescriptor **field_1;
  cpp *field_02;
  cpp *this_01;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Db;
  Hex hex;
  undefined1 auVar22 [16];
  LogFinisher local_179;
  uint32_t local_178;
  int cached_has_word_index;
  MessageGenerator *local_170;
  int local_164;
  Printer *local_160;
  FieldGeneratorMap *local_158;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  Formatter format;
  string chunk_mask_str;
  ColdChunkSkipper cold_skipper;
  
  options = &this->options_;
  bVar5 = HasSimpleBaseClass(this->descriptor_,options);
  if (!bVar5) {
    format.printer_ = printer;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
    Formatter::operator()<>
              (&format,
               "void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
              );
    io::Printer::Indent(format.printer_);
    Formatter::operator()<>
              (&format,
               "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
              );
    if (0 < *(int *)(this->descriptor_ + 0x78)) {
      Formatter::operator()<>(&format,"_extensions_.Clear();\n");
    }
    ppFVar1 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    iVar17 = 0;
    for (ppFVar15 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppFVar15 != ppFVar1;
        ppFVar15 = ppFVar15 + 1) {
      bVar5 = CanInitializeByZeroing(*ppFVar15);
      if (bVar5) {
        iVar7 = EstimateAlignmentSize(*ppFVar15);
        iVar17 = iVar17 + iVar7;
      }
    }
    uVar20 = 0;
    uVar21 = 0;
    chunks.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    chunks.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    chunks.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158 = (FieldGeneratorMap *)
                (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar7 = 0;
    local_170 = this;
    local_164 = iVar17;
    local_160 = printer;
    for (ppFVar15 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; pMVar18 = local_170,
        (FieldGeneratorMap *)ppFVar15 != local_158; ppFVar15 = ppFVar15 + 1) {
      pFVar14 = *ppFVar15;
      iVar17 = iVar7;
      cold_skipper.chunks_ =
           (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            *)pFVar14;
      if (chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002da98f:
        iVar8 = iVar17;
        std::
        vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ::emplace_back<>(&chunks);
      }
      else {
        field_00 = chunks.
                   super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
        iVar8 = HasByteIndex(local_170,field_00);
        iVar9 = HasByteIndex(local_170,pFVar14);
        iVar17 = 0;
        if ((iVar8 != iVar9) ||
           (((~(byte)pFVar14[1] & 0x60) == 0) != ((~(byte)field_00[1] & 0x60) == 0)))
        goto LAB_002da98f;
        bVar5 = CanInitializeByZeroing(field_00);
        bVar6 = CanInitializeByZeroing(pFVar14);
        iVar8 = iVar7 + 1;
        if ((bVar5 != bVar6) &&
           (bVar5 = CanInitializeByZeroing(field_00), !bVar5 || iVar7 != 0 && local_164 < 5))
        goto LAB_002da98f;
      }
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back(chunks.
                  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1,(value_type *)&cold_skipper);
      uVar20 = extraout_XMM0_Da;
      uVar21 = extraout_XMM0_Db;
      iVar7 = iVar8;
    }
    fields = &local_170->has_bit_indices_;
    anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
              (&cold_skipper,options,&chunks,fields,(double)CONCAT44(uVar21,uVar20));
    cached_has_word_index = -1;
    local_158 = &pMVar18->field_generators_;
    for (uVar16 = 0;
        pvVar4 = chunks.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, from = (string *)0x18,
        uVar16 < (ulong)(((long)chunks.
                                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)chunks.
                               super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar16 = uVar16 + 1) {
      std::__cxx11::string::string((string *)&vars,"",(allocator *)&chunk_mask_str);
      anon_unknown_0::ColdChunkSkipper::OnStartChunk
                (&cold_skipper,(int)local_160,cached_has_word_index_00,from,in_R8);
      this_00 = (anon_unknown_0 *)(pvVar4 + uVar16);
      std::__cxx11::string::~string((string *)&vars);
      puVar2 = *(undefined8 **)(this_00 + 8);
      bVar5 = false;
      this_01 = (cpp *)0x0;
      field_02 = (cpp *)0x0;
      for (puVar19 = *(undefined8 **)this_00; pMVar18 = local_170, puVar19 != puVar2;
          puVar19 = puVar19 + 1) {
        bVar6 = CanInitializeByZeroing((FieldDescriptor *)*puVar19);
        if (bVar6) {
          if (bVar5) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&vars,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xccd);
            pLVar12 = internal::LogMessage::operator<<
                                ((LogMessage *)&vars,"CHECK failed: !saw_non_zero_init: ");
            internal::LogFinisher::operator=((LogFinisher *)&chunk_mask_str,pLVar12);
            internal::LogMessage::~LogMessage((LogMessage *)&vars);
          }
          this_01 = (cpp *)*puVar19;
          if (field_02 == (cpp *)0x0) {
            field_02 = this_01;
          }
        }
        else {
          bVar5 = true;
        }
      }
      iVar17 = HasBitIndex(local_170,(FieldDescriptor *)**(undefined8 **)this_00);
      if (((iVar17 == -1) || ((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) < 9)) ||
         ((this_01 == *(cpp **)(*(long *)(this_00 + 8) + -8) && (local_164 < 5)))) {
        local_178 = 0;
        pFVar14 = has_bit_indices;
      }
      else {
        local_178 = anon_unknown_0::GenChunkMask
                              (this_00,(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        *)fields,
                               (vector<int,_std::allocator<int>_> *)has_bit_indices);
        hex.value = (ulong)local_178;
        hex._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)&vars,hex);
        StrCat_abi_cxx11_(&chunk_mask_str,(protobuf *)&vars,a);
        uVar11 = anon_unknown_0::popcnt(local_178);
        if ((int)uVar11 < 2) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&vars,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xce7);
          pLVar12 = internal::LogMessage::operator<<
                              ((LogMessage *)&vars,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
          internal::LogFinisher::operator=(&local_179,pLVar12);
LAB_002dad76:
          internal::LogMessage::~LogMessage((LogMessage *)&vars);
        }
        else if (8 < uVar11) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&vars,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xce8);
          pLVar12 = internal::LogMessage::operator<<
                              ((LogMessage *)&vars,"CHECK failed: (8) >= (popcnt(chunk_mask)): ");
          internal::LogFinisher::operator=(&local_179,pLVar12);
          goto LAB_002dad76;
        }
        iVar17 = cached_has_word_index;
        iVar7 = HasWordIndex(pMVar18,(FieldDescriptor *)**(undefined8 **)this_00);
        if (iVar17 != iVar7) {
          cached_has_word_index = HasWordIndex(pMVar18,(FieldDescriptor *)**(undefined8 **)this_00);
          Formatter::operator()
                    (&format,"cached_has_bits = _has_bits_[$1$];\n",&cached_has_word_index);
        }
        Formatter::operator()(&format,"if (cached_has_bits & 0x$1$u) {\n",&chunk_mask_str);
        io::Printer::Indent(format.printer_);
        auVar22 = std::__cxx11::string::~string((string *)&chunk_mask_str);
        pFVar14 = auVar22._8_8_;
        local_178 = (uint32_t)CONCAT71(auVar22._1_7_,1);
      }
      if (field_02 != (cpp *)0x0) {
        if (field_02 == this_01) {
          pFVar13 = FieldGeneratorMap::get(local_158,(FieldDescriptor *)field_02);
          (*pFVar13->_vptr_FieldGenerator[0xb])(pFVar13,local_160);
        }
        else {
          FieldName_abi_cxx11_((string *)&vars,field_02,pFVar14);
          FieldName_abi_cxx11_(&chunk_mask_str,this_01,field_01);
          Formatter::operator()
                    (&format,
                     "::memset(&$1$_, 0, static_cast<size_t>(\n    reinterpret_cast<char*>(&$2$_) -\n    reinterpret_cast<char*>(&$1$_)) + sizeof($2$_));\n"
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
                     &chunk_mask_str);
          std::__cxx11::string::~string((string *)&chunk_mask_str);
          std::__cxx11::string::~string((string *)&vars);
        }
      }
      pPVar3 = local_160;
      puVar2 = *(undefined8 **)(this_00 + 8);
      for (puVar19 = *(undefined8 **)this_00; puVar19 != puVar2; puVar19 = puVar19 + 1) {
        bVar5 = CanInitializeByZeroing((FieldDescriptor *)*puVar19);
        if (!bVar5) {
          iVar17 = HasBitIndex(pMVar18,(FieldDescriptor *)*puVar19);
          if ((iVar17 == -1) ||
             ((CVar10 = FieldDescriptor::cpp_type((FieldDescriptor *)*puVar19),
              CVar10 != CPPTYPE_MESSAGE &&
              (CVar10 = FieldDescriptor::cpp_type((FieldDescriptor *)*puVar19),
              CVar10 != CPPTYPE_STRING)))) {
            bVar5 = false;
          }
          else {
            bVar5 = true;
            anon_unknown_0::PrintPresenceCheck
                      (&format,(FieldDescriptor *)*puVar19,fields,(Printer *)&cached_has_word_index,
                       (int *)in_R8);
          }
          pFVar13 = FieldGeneratorMap::get(local_158,(FieldDescriptor *)*puVar19);
          (*pFVar13->_vptr_FieldGenerator[0xb])(pFVar13,pPVar3);
          if (bVar5) {
            io::Printer::Outdent(format.printer_);
            Formatter::operator()<>(&format,"}\n");
          }
        }
      }
      if ((char)local_178 != '\0') {
        io::Printer::Outdent(format.printer_);
        Formatter::operator()<>(&format,"}\n");
      }
      bVar5 = anon_unknown_0::ColdChunkSkipper::OnEndChunk(&cold_skipper,(int)uVar16,local_160);
      if (bVar5) {
        cached_has_word_index = -1;
      }
    }
    vars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pMVar18->descriptor_;
    vars._M_t._M_impl._0_4_ = 0;
    chunk_mask_str._M_dataplus._M_p._0_4_ =
         *(undefined4 *)(vars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x6c);
    chunk_mask_str._M_string_length = vars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    while (bVar5 = operator!=((Iterator *)&vars,(Iterator *)&chunk_mask_str), pMVar18 = local_170,
          bVar5) {
      Formatter::operator()
                (&format,"clear_$1$();\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (*(long *)(vars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x30) + 8 +
                  (long)(int)vars._M_t._M_impl._0_4_ * 0x28));
      vars._M_t._M_impl._0_4_ = vars._M_t._M_impl._0_4_ + 1;
    }
    if (local_170->num_weak_fields_ != 0) {
      Formatter::operator()<>(&format,"_weak_field_map_.ClearAll();\n");
    }
    if ((pMVar18->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pMVar18->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Formatter::operator()<>(&format,"_has_bits_.Clear();\n");
    }
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    SetUnknownFieldsVariable(pMVar18->descriptor_,options,&vars);
    Formatter::AddMap(&format,&vars);
    Formatter::operator()<>(&format,"_internal_metadata_.Clear<$unknown_fields_type$>();\n");
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&cold_skipper.variables_._M_t);
    std::
    vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::~vector(&chunks);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&format.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClear(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  // The maximum number of bytes we will memset to zero without checking their
  // hasbit to see if a zero-init is necessary.
  const int kMaxUnconditionalPrimitiveBytesClear = 4;

  format(
      "void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n");
  format.Indent();

  format(
      // TODO(jwb): It would be better to avoid emitting this if it is not used,
      // rather than emitting a workaround for the resulting warning.
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  if (descriptor_->extension_range_count() > 0) {
    format("_extensions_.Clear();\n");
  }

  // Collect fields into chunks. Each chunk may have an if() condition that
  // checks all hasbits in the chunk and skips it if none are set.
  int zero_init_bytes = 0;
  for (const auto& field : optimized_order_) {
    if (CanInitializeByZeroing(field)) {
      zero_init_bytes += EstimateAlignmentSize(field);
    }
  }
  bool merge_zero_init = zero_init_bytes > kMaxUnconditionalPrimitiveBytesClear;
  int chunk_count = 0;

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        chunk_count++;
        // This predicate guarantees that there is only a single zero-init
        // (memset) per chunk, and if present it will be at the beginning.
        bool same = HasByteIndex(a) == HasByteIndex(b) &&
                    a->is_repeated() == b->is_repeated() &&
                    (CanInitializeByZeroing(a) == CanInitializeByZeroing(b) ||
                     (CanInitializeByZeroing(a) &&
                      (chunk_count == 1 || merge_zero_init)));
        if (!same) chunk_count = 0;
        return same;
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    const FieldDescriptor* memset_start = nullptr;
    const FieldDescriptor* memset_end = nullptr;
    bool saw_non_zero_init = false;

    for (const auto& field : chunk) {
      if (CanInitializeByZeroing(field)) {
        GOOGLE_CHECK(!saw_non_zero_init);
        if (!memset_start) memset_start = field;
        memset_end = field;
      } else {
        saw_non_zero_init = true;
      }
    }

    // Whether we wrap this chunk in:
    //   if (cached_has_bits & <chunk hasbits) { /* chunk. */ }
    // We can omit the if() for chunk size 1, or if our fields do not have
    // hasbits. I don't understand the rationale for the last part of the
    // condition, but it matches the old logic.
    const bool have_outer_if = HasBitIndex(chunk.front()) != kNoHasbit &&
                               chunk.size() > 1 &&
                               (memset_end != chunk.back() || merge_zero_init);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    if (memset_start) {
      if (memset_start == memset_end) {
        // For clarity, do not memset a single field.
        field_generators_.get(memset_start)
            .GenerateMessageClearingCode(printer);
      } else {
        format(
            "::memset(&$1$_, 0, static_cast<size_t>(\n"
            "    reinterpret_cast<char*>(&$2$_) -\n"
            "    reinterpret_cast<char*>(&$1$_)) + sizeof($2$_));\n",
            FieldName(memset_start), FieldName(memset_end));
      }
    }

    // Clear all non-zero-initializable fields in the chunk.
    for (const auto& field : chunk) {
      if (CanInitializeByZeroing(field)) continue;
      // It's faster to just overwrite primitive types, but we should only
      // clear strings and messages if they were set.
      //
      // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
      bool have_enclosing_if =
          HasBitIndex(field) != kNoHasbit &&
          (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
           field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);

      if (have_enclosing_if) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
      }

      field_generators_.get(field).GenerateMessageClearingCode(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Step 4: Unions.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("clear_$1$();\n", oneof->name());
  }

  if (num_weak_fields_) {
    format("_weak_field_map_.ClearAll();\n");
  }

  // We don't clear donated status.

  if (!has_bit_indices_.empty()) {
    // Step 5: Everything else.
    format("_has_bits_.Clear();\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);
  format("_internal_metadata_.Clear<$unknown_fields_type$>();\n");

  format.Outdent();
  format("}\n");
}